

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

znzFile nifti_image_write_hdr_img2
                  (nifti_image *nim,int write_opts,char *opts,znzFile imgfile,nifti_brick_list *NBL)

{
  znzFile pzVar1;
  uint write_data_00;
  uint leave_open_00;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  nifti_1_header local_334;
  char local_1d8 [8];
  char func [27];
  int leave_open;
  int write_data;
  size_t ss;
  znzFile fp;
  nifti_1_header nhdr;
  nifti_brick_list *NBL_local;
  znzFile imgfile_local;
  char *opts_local;
  int write_opts_local;
  nifti_image *nim_local;
  
  ss = 0;
  builtin_strncpy(local_1d8,"nifti_im",8);
  builtin_strncpy(func,"age_write_hdr_img2",0x13);
  write_data_00 = write_opts & 1;
  leave_open_00 = write_opts & 2;
  nhdr._340_8_ = NBL;
  if (nim == (nifti_image *)0x0) {
    fprintf(_stderr,"** ERROR: nifti_image_write_hdr_img: %s\n","NULL input");
    nim_local = (nifti_image *)ss;
  }
  else {
    iVar2 = nifti_validfilename(nim->fname);
    if (iVar2 == 0) {
      fprintf(_stderr,"** ERROR: nifti_image_write_hdr_img: %s\n","bad fname input");
      nim_local = (nifti_image *)ss;
    }
    else if (((write_data_00 == 0) || (nim->data != (void *)0x0)) || (nhdr._340_8_ != 0)) {
      if (((write_data_00 == 0) || (nhdr._340_8_ == 0)) ||
         (iVar2 = nifti_NBL_matches_nim(nim,(nifti_brick_list *)nhdr._340_8_), iVar2 != 0)) {
        nifti_set_iname_offset(nim);
        if ((1 < g_opts.debug) &&
           (fprintf(_stderr,"-d writing nifti file \'%s\'...\n",nim->fname), 2 < g_opts.debug)) {
          fprintf(_stderr,"-d nifti type %d, offset %d\n",(ulong)(uint)nim->nifti_type);
        }
        if (nim->nifti_type == 3) {
          nim_local = (nifti_image *)
                      nifti_write_ascii_image
                                (nim,(nifti_brick_list *)nhdr._340_8_,opts,write_data_00,
                                 leave_open_00);
        }
        else {
          nifti_convert_nim2nhdr(&local_334,nim);
          memcpy((void *)((long)&fp + 4),&local_334,0x15c);
          if (nim->nifti_type != 1) {
            if ((nim->iname != (char *)0x0) && (iVar2 = strcmp(nim->iname,nim->fname), iVar2 == 0))
            {
              free(nim->iname);
              nim->iname = (char *)0x0;
            }
            if (nim->iname == (char *)0x0) {
              pcVar3 = nifti_makeimgname(nim->fname,nim->nifti_type,0,0);
              nim->iname = pcVar3;
              if (nim->iname == (char *)0x0) {
                return (znzFile)0x0;
              }
            }
          }
          if ((imgfile == (znzFile)0x0) || (nim->nifti_type != 1)) {
            if (2 < g_opts.debug) {
              fprintf(_stderr,"+d opening output file %s [%s]\n",nim->fname,opts);
            }
            pcVar3 = nim->fname;
            iVar2 = nifti_is_gzfile(nim->fname);
            ss = (size_t)znzopen(pcVar3,opts,iVar2);
            pzVar1 = (znzFile)ss;
            if ((znzFile)ss == (znzFile)0x0) {
              fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",local_1d8,"cannot open output file",
                      nim->fname);
              return (znzFile)ss;
            }
          }
          else {
            pzVar1 = imgfile;
            if (2 < g_opts.debug) {
              fprintf(_stderr,"+d using passed file for hdr\n");
              pzVar1 = imgfile;
            }
          }
          ss = (size_t)pzVar1;
          sVar4 = znzwrite((void *)((long)&fp + 4),1,0x15c,(znzFile)ss);
          if (sVar4 < 0x15c) {
            fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",local_1d8,"bad header write to output file"
                    ,nim->fname);
            Xznzclose((znzFile *)&ss);
            nim_local = (nifti_image *)ss;
          }
          else {
            if (nim->nifti_type != 0) {
              nifti_write_extensions((znzFile)ss,nim);
            }
            if ((write_data_00 == 0) && (leave_open_00 == 0)) {
              if (2 < g_opts.debug) {
                fprintf(_stderr,"-d header is all we want: done\n");
              }
              Xznzclose((znzFile *)&ss);
              nim_local = (nifti_image *)ss;
            }
            else {
              pzVar1 = (znzFile)ss;
              if (nim->nifti_type != 1) {
                Xznzclose((znzFile *)&ss);
                if (imgfile == (znzFile)0x0) {
                  if (2 < g_opts.debug) {
                    fprintf(_stderr,"+d opening img file \'%s\'\n",nim->iname);
                  }
                  pcVar3 = nim->iname;
                  iVar2 = nifti_is_gzfile(nim->iname);
                  ss = (size_t)znzopen(pcVar3,opts,iVar2);
                  pzVar1 = (znzFile)ss;
                  if ((znzFile)ss == (znzFile)0x0) {
                    fprintf(_stderr,"** ERROR: nifti_image_write_hdr_img: %s\n",
                            "cannot open image file");
                    return (znzFile)ss;
                  }
                }
                else {
                  pzVar1 = imgfile;
                  if (2 < g_opts.debug) {
                    fprintf(_stderr,"+d using passed file for img\n");
                    pzVar1 = imgfile;
                  }
                }
              }
              ss = (size_t)pzVar1;
              znzseek((znzFile)ss,(long)nim->iname_offset,0);
              if (write_data_00 != 0) {
                nifti_write_all_data((znzFile)ss,nim,(nifti_brick_list *)nhdr._340_8_);
              }
              if (leave_open_00 == 0) {
                Xznzclose((znzFile *)&ss);
              }
              nim_local = (nifti_image *)ss;
            }
          }
        }
      }
      else {
        fprintf(_stderr,"** ERROR: nifti_image_write_hdr_img: %s\n","NBL does not match nim");
        nim_local = (nifti_image *)ss;
      }
    }
    else {
      fprintf(_stderr,"** ERROR: nifti_image_write_hdr_img: %s\n","no image data");
      nim_local = (nifti_image *)ss;
    }
  }
  return (znzFile)nim_local;
}

Assistant:

znzFile nifti_image_write_hdr_img2(nifti_image *nim, int write_opts,
               const char * opts, znzFile imgfile, const nifti_brick_list * NBL)
{
   struct nifti_1_header nhdr ;
   znzFile               fp=NULL;
   size_t                ss ;
   int                   write_data, leave_open;
   char                  func[] = { "nifti_image_write_hdr_img2" };

   write_data = write_opts & 1;  /* just separate the bits now */
   leave_open = write_opts & 2;

   if( ! nim                              ) ERREX("NULL input") ;
   if( ! nifti_validfilename(nim->fname)  ) ERREX("bad fname input") ;
   if( write_data && ! nim->data && ! NBL ) ERREX("no image data") ;

   if( write_data && NBL && ! nifti_NBL_matches_nim(nim, NBL) )
      ERREX("NBL does not match nim");

   nifti_set_iname_offset(nim);

   if( g_opts.debug > 1 ){
      fprintf(stderr,"-d writing nifti file '%s'...\n", nim->fname);
      if( g_opts.debug > 2 )
         fprintf(stderr,"-d nifti type %d, offset %d\n",
                 nim->nifti_type, nim->iname_offset);
   }

   if( nim->nifti_type == NIFTI_FTYPE_ASCII )   /* non-standard case */
      return nifti_write_ascii_image(nim,NBL,opts,write_data,leave_open);

   nhdr = nifti_convert_nim2nhdr(nim);    /* create the nifti1_header struct */

   /* if writing to 2 files, make sure iname is set and different from fname */
   if( nim->nifti_type != NIFTI_FTYPE_NIFTI1_1 ){
       if( nim->iname && strcmp(nim->iname,nim->fname) == 0 ){
         free(nim->iname) ; nim->iname = NULL ;
       }
       if( nim->iname == NULL ){ /* then make a new one */
         nim->iname = nifti_makeimgname(nim->fname,nim->nifti_type,0,0);
         if( nim->iname == NULL ) return NULL;
       }
   }

   /* if we have an imgfile and will write the header there, use it */
   if( ! znz_isnull(imgfile) && nim->nifti_type == NIFTI_FTYPE_NIFTI1_1 ){
      if( g_opts.debug > 2 ) fprintf(stderr,"+d using passed file for hdr\n");
      fp = imgfile;
   }
   else {
      if( g_opts.debug > 2 )
         fprintf(stderr,"+d opening output file %s [%s]\n",nim->fname,opts);
      fp = znzopen( nim->fname , opts , nifti_is_gzfile(nim->fname) ) ;
      if( znz_isnull(fp) ){
         LNI_FERR(func,"cannot open output file",nim->fname);
         return fp;
      }
   }

   /* write the header and extensions */

   ss = znzwrite(&nhdr , 1 , sizeof(nhdr) , fp); /* write header */
   if( ss < sizeof(nhdr) ){
      LNI_FERR(func,"bad header write to output file",nim->fname);
      znzclose(fp); return fp;
   }

   /* partial file exists, and errors have been printed, so ignore return */
   if( nim->nifti_type != NIFTI_FTYPE_ANALYZE )
      (void)nifti_write_extensions(fp,nim);

   /* if the header is all we want, we are done */
   if( ! write_data && ! leave_open ){
      if( g_opts.debug > 2 ) fprintf(stderr,"-d header is all we want: done\n");
      znzclose(fp); return(fp);
   }

   if( nim->nifti_type != NIFTI_FTYPE_NIFTI1_1 ){ /* get a new file pointer */
      znzclose(fp);         /* first, close header file */
      if( ! znz_isnull(imgfile) ){
         if(g_opts.debug > 2) fprintf(stderr,"+d using passed file for img\n");
         fp = imgfile;
      }
      else {
         if( g_opts.debug > 2 )
            fprintf(stderr,"+d opening img file '%s'\n", nim->iname);
         fp = znzopen( nim->iname , opts , nifti_is_gzfile(nim->iname) ) ;
         if( znz_isnull(fp) ) ERREX("cannot open image file") ;
      }
   }

   znzseek(fp, nim->iname_offset, SEEK_SET);  /* in any case, seek to offset */

   if( write_data ) nifti_write_all_data(fp,nim,NBL);
   if( ! leave_open ) znzclose(fp);

   return fp;
}